

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
check_and_initialize_maps
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,
          Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this
          ,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
           *maps)

{
  pointer ppPVar1;
  long *plVar2;
  long *plVar3;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *pPVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  allocator_type local_51;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> v;
  
  ppPVar1 = (maps->
            super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    if ((long)(maps->
              super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3 == lVar6) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(__return_storage_ptr__,
               ((long)*(pointer *)
                       ((long)&((*ppPVar1)->heat_map).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl + 8) -
               *(long *)&((*ppPVar1)->heat_map).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data) / 0x18,(allocator_type *)&v);
      lVar6 = 0;
      lVar7 = 0;
      while( true ) {
        pPVar4 = *(maps->
                  super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        plVar2 = *(long **)&(pPVar4->heat_map).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        if (lVar7 == ((long)*(pointer *)
                             ((long)&(pPVar4->heat_map).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl + 8) - (long)plVar2) / 0x18) break;
        local_50 = 0.0;
        std::vector<double,_std::allocator<double>_>::vector
                  (&v,plVar2[1] - *plVar2 >> 3,&local_50,&local_51);
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((__return_storage_ptr__->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar6),&v);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&v);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x18;
      }
      return __return_storage_ptr__;
    }
    plVar2 = *(long **)&(ppPVar1[lVar6]->heat_map).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
    plVar3 = *(long **)&((*ppPVar1)->heat_map).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
  } while (((long)*(pointer *)
                   ((long)&(ppPVar1[lVar6]->heat_map).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl + 8) - (long)plVar2 ==
            (long)*(pointer *)
                   ((long)&((*ppPVar1)->heat_map).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl + 8) - (long)plVar3) &&
          (lVar6 = lVar6 + 1, plVar2[1] - *plVar2 == plVar3[1] - *plVar3));
  std::operator<<((ostream *)&std::cerr,
                  "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n"
                 );
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::vector<std::vector<double> > Persistence_heat_maps<Scalling_of_kernels>::check_and_initialize_maps(
    const std::vector<Persistence_heat_maps*>& maps) {
  // checking if all the heat maps are of the same size:
  for (size_t i = 0; i != maps.size(); ++i) {
    if (maps[i]->heat_map.size() != maps[0]->heat_map.size()) {
      std::cerr << "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      throw "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
    }
    if (maps[i]->heat_map[0].size() != maps[0]->heat_map[0].size()) {
      std::cerr << "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      throw "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
    }
  }
  std::vector<std::vector<double> > heat_maps(maps[0]->heat_map.size());
  for (size_t i = 0; i != maps[0]->heat_map.size(); ++i) {
    std::vector<double> v(maps[0]->heat_map[0].size(), 0);
    heat_maps[i] = v;
  }
  return heat_maps;
}